

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::~TDeletingArray
          (TDeletingArray<FInternalLightAssociation_*,_FInternalLightAssociation_*> *this)

{
  FInternalLightAssociation *pFVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0;
      uVar2 < (this->super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>).Count;
      uVar2 = uVar2 + 1) {
    pFVar1 = (this->super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>).Array
             [uVar2];
    if (pFVar1 != (FInternalLightAssociation *)0x0) {
      operator_delete(pFVar1,0x10);
    }
  }
  TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>::~TArray
            (&this->super_TArray<FInternalLightAssociation_*,_FInternalLightAssociation_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}